

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O3

ostream * wasm::String::writeWTF16CodePoint(ostream *os,uint32_t u)

{
  uint uVar1;
  
  if (u < 0x110000) {
    if (0xffff < u) {
      uVar1 = u + 0x3ff0000;
      u = u & 0x3ff | 0xdc00;
      anon_unknown_0::writeWTF16CodeUnit(os,(short)(uVar1 >> 10) + 0xd800);
    }
    anon_unknown_0::writeWTF16CodeUnit(os,(uint16_t)u);
    return os;
  }
  __assert_fail("u < 0x110000",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/string.cpp"
                ,0x135,"std::ostream &wasm::String::writeWTF16CodePoint(std::ostream &, uint32_t)");
}

Assistant:

std::ostream& writeWTF16CodePoint(std::ostream& os, uint32_t u) {
  assert(u < 0x110000);
  if (u < 0x10000) {
    writeWTF16CodeUnit(os, u);
  } else {
    // Encode with a surrogate pair.
    uint16_t high = 0xD800 + ((u - 0x10000) >> 10);
    uint16_t low = 0xDC00 + ((u - 0x10000) & 0x3FF);
    writeWTF16CodeUnit(os, high);
    writeWTF16CodeUnit(os, low);
  }
  return os;
}